

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void add_symbol_value(ListNode *symbol_map_head,char **symbol_names,size_t number_of_symbol_names,
                     void *value,int refcount)

{
  long lVar1;
  int iVar2;
  undefined8 *puVar3;
  size_t in_RCX;
  char **in_RDX;
  ListNode *in_RSI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  SymbolMapValue *new_symbol_map_value;
  SymbolMapValue *target_map_value;
  char *symbol_name;
  ListNode *target_node;
  int in_stack_ffffffffffffffac;
  ListNode **in_stack_ffffffffffffffb0;
  int refcount_00;
  EqualityFunction in_stack_ffffffffffffffb8;
  unsigned_long in_stack_ffffffffffffffc0;
  ListNode *head;
  undefined4 in_stack_ffffffffffffffc8;
  ListNode *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _assert_true(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
               (char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  _assert_true(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
               (char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  _assert_true(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
               (char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  head = (ListNode *)in_RSI->value;
  iVar2 = list_find((ListNode *)CONCAT44(in_R8D,in_stack_ffffffffffffffc8),head,
                    in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  refcount_00 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  if (iVar2 == 0) {
    puVar3 = (undefined8 *)malloc(0x28);
    *puVar3 = head;
    list_initialize((ListNode *)(puVar3 + 1));
    refcount_00 = (int)((ulong)puVar3 >> 0x20);
    local_10 = list_add_value(head,in_stack_ffffffffffffffb8,refcount_00);
  }
  if (in_RDX == (char **)0x1) {
    list_add_value(head,local_10->value,refcount_00);
  }
  else {
    add_symbol_value(in_RSI,in_RDX,in_RCX,(void *)CONCAT44(in_R8D,in_stack_ffffffffffffffc8),
                     (int)((ulong)head >> 0x20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void add_symbol_value(ListNode * const symbol_map_head,
                             const char * const symbol_names[],
                             const size_t number_of_symbol_names,
                             const void* value, const int refcount) {
    const char* symbol_name;
    ListNode *target_node;
    SymbolMapValue *target_map_value;
    assert_non_null(symbol_map_head);
    assert_non_null(symbol_names);
    assert_true(number_of_symbol_names);
    symbol_name = symbol_names[0];

    if (!list_find(symbol_map_head, symbol_name, symbol_names_match,
                   &target_node)) {
        SymbolMapValue * const new_symbol_map_value =
            (SymbolMapValue*)malloc(sizeof(*new_symbol_map_value));
        new_symbol_map_value->symbol_name = symbol_name;
        list_initialize(&new_symbol_map_value->symbol_values_list_head);
        target_node = list_add_value(symbol_map_head, new_symbol_map_value,
                                          1);
    }

    target_map_value = (SymbolMapValue*)target_node->value;
    if (number_of_symbol_names == 1) {
            list_add_value(&target_map_value->symbol_values_list_head,
                                value, refcount);
    } else {
        add_symbol_value(&target_map_value->symbol_values_list_head,
                         &symbol_names[1], number_of_symbol_names - 1, value,
                         refcount);
    }
}